

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::addTestGroups
               (EglTestContext *eglTestCtx,TestCaseGroup *group,NativeType type)

{
  NativeColorMappingCase *pNVar1;
  pointer filters;
  allocator<char> local_b9;
  TestCaseGroup *local_b8;
  EglTestContext *local_b0;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  FilterList baseFilters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  baseFilters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  baseFilters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  baseFilters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = group;
  local_b0 = eglTestCtx;
  eglu::FilterList::operator<<
            (&baseFilters,(ConfigFilter)(&PTR_surfaceType<4u>_003d8728)[(int)type]);
  filterLists.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filterLists.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filterLists.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&filterLists,&baseFilters);
  for (filters = filterLists.
                 super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      filters !=
      filterLists.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish; filters = filters + 1) {
    pNVar1 = (NativeColorMappingCase *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(filters->m_name)._M_dataplus._M_p,&local_b9);
    std::operator+(&local_70,&local_50,"_clear");
    NativeColorMappingCase::NativeColorMappingCase
              (pNVar1,local_b0,local_70._M_dataplus._M_p,(filters->m_description)._M_dataplus._M_p,
               false,type,&filters->super_FilterList);
    tcu::TestNode::addChild((TestNode *)local_b8,(TestNode *)pNVar1);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pNVar1 = (NativeColorMappingCase *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(filters->m_name)._M_dataplus._M_p,&local_b9);
    std::operator+(&local_70,&local_50,"_render");
    NativeColorMappingCase::NativeColorMappingCase
              (pNVar1,local_b0,local_70._M_dataplus._M_p,(filters->m_description)._M_dataplus._M_p,
               true,type,&filters->super_FilterList);
    tcu::TestNode::addChild((TestNode *)local_b8,(TestNode *)pNVar1);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&filterLists);
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base((_Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                   *)&baseFilters);
  return;
}

Assistant:

void addTestGroups (EglTestContext& eglTestCtx, TestCaseGroup* group, NativeColorMappingCase::NativeType type)
{
	eglu::FilterList baseFilters;

	switch (type)
	{
		case NativeColorMappingCase::NATIVETYPE_WINDOW:
			baseFilters << surfaceType<EGL_WINDOW_BIT>;
			break;

		case NativeColorMappingCase::NATIVETYPE_PIXMAP:
			baseFilters << surfaceType<EGL_PIXMAP_BIT>;
			break;

		case NativeColorMappingCase::NATIVETYPE_PBUFFER_COPY_TO_PIXMAP:
			baseFilters << surfaceType<EGL_PBUFFER_BIT>;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	vector<NamedFilterList> filterLists;
	getDefaultFilterLists(filterLists, baseFilters);

	for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
	{
		group->addChild(new NativeColorMappingCase(eglTestCtx, (string(i->getName()) + "_clear").c_str(), i->getDescription(), false, type, *i));
		group->addChild(new NativeColorMappingCase(eglTestCtx, (string(i->getName()) + "_render").c_str(), i->getDescription(), true, type, *i));
	}
}